

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O1

void libcellml::removeCellml1XNamespaces(XmlNodePtr *node,bool childrenOnly)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined7 in_register_00000031;
  _Alloc_hider this_00;
  XmlNamespaceMap definedNamespaces;
  string local_88;
  undefined4 local_64;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_64 = (undefined4)CONCAT71(in_register_00000031,childrenOnly);
  this_00._M_p = (pointer)(node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr;
  this = (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)this_00._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar1 = &local_88.field_2;
    do {
      XmlNode::definedNamespaces_abi_cxx11_((XmlNamespaceMap *)&local_60,(XmlNode *)this_00._M_p);
      for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        iVar3 = std::__cxx11::string::compare((char *)(p_Var4 + 2));
        if (iVar3 == 0) {
          local_88._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"http://www.cellml.org/cellml/1.0#","");
          XmlNode::removeNamespaceDefinition((XmlNode *)this_00._M_p,&local_88);
LAB_0029a4c3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)(p_Var4 + 2));
          if (iVar3 == 0) {
            local_88._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"http://www.cellml.org/cellml/1.1#","");
            XmlNode::removeNamespaceDefinition((XmlNode *)this_00._M_p,&local_88);
            goto LAB_0029a4c3;
          }
        }
      }
      XmlNode::firstChild((XmlNode *)&local_88);
      removeCellml1XNamespaces((XmlNodePtr *)&local_88,false);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
      if ((char)local_64 == '\0') {
        XmlNode::next((XmlNode *)&local_88);
        sVar2 = local_88._M_string_length;
        this_00._M_p = local_88._M_dataplus._M_p;
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_88._M_string_length = 0;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
        }
      }
      else {
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        this_00._M_p = (pointer)0x0;
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)this_00._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return;
}

Assistant:

void removeCellml1XNamespaces(const XmlNodePtr &node, bool childrenOnly)
{
    auto tempNode = node;
    while (tempNode != nullptr) {
        auto definedNamespaces = tempNode->definedNamespaces();
        XmlNamespaceMap::const_iterator it;
        for (it = definedNamespaces.begin(); it != definedNamespaces.end(); ++it) {
            if (it->second == CELLML_1_0_NS) {
                tempNode->removeNamespaceDefinition(CELLML_1_0_NS);
            } else if (it->second == CELLML_1_1_NS) {
                tempNode->removeNamespaceDefinition(CELLML_1_1_NS);
            }
        }

        removeCellml1XNamespaces(tempNode->firstChild());

        if (childrenOnly) {
            tempNode = nullptr;
        } else {
            tempNode = tempNode->next();
        }
    }
}